

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O3

void __thiscall
merlin::graphical_model::erase
          (graphical_model *this,
          vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          *adj,findex idx,variable_set *vs)

{
  pointer puVar1;
  ulong uVar2;
  findex local_28;
  
  puVar1 = (vs->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((vs->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    uVar2 = 0;
    local_28 = idx;
    do {
      my_set<unsigned_long>::operator/=
                ((adj->
                 super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + puVar1[uVar2],&local_28);
      uVar2 = uVar2 + 1;
      puVar1 = (vs->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(vs->m_v).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3));
  }
  return;
}

Assistant:

void erase(std::vector<flist>& adj, findex idx, const variable_set& vs) {
		for (size_t i = 0; i < vs.nvar(); ++i)
			adj[vs[i]] /= idx; 		//   remove a factor from each var's adj list
	}